

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::EnumGenerator::GenerateDescriptorInitializer
          (EnumGenerator *this,Printer *printer)

{
  EnumDescriptor *pEVar1;
  mapped_type *pmVar2;
  undefined1 qualified;
  long *plVar3;
  int i;
  char *text;
  allocator local_89;
  key_type local_88;
  string local_68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pEVar1 = this->descriptor_;
  plVar3 = (long *)(*(long *)(pEVar1 + 0x10) + 0x70);
  if (*(long *)(pEVar1 + 0x18) != 0) {
    plVar3 = (long *)(*(long *)(pEVar1 + 0x18) + 0x60);
  }
  qualified = 0x38;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  SimpleItoa_abi_cxx11_
            (&local_68,(protobuf *)(((long)pEVar1 - *plVar3) / 0x38 & 0xffffffff),
             (int)(((long)pEVar1 - *plVar3) % 0x38));
  std::__cxx11::string::string((string *)&local_88,"index",&local_89);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_88);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  SimpleItoa_abi_cxx11_(&local_68,(protobuf *)(ulong)(uint)this->index_in_metadata_,i);
  std::__cxx11::string::string((string *)&local_88,"index_in_metadata",&local_89);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_88);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  if (*(cpp **)(this->descriptor_ + 0x18) == (cpp *)0x0) {
    text = "file_level_enum_descriptors[$index_in_metadata$] = file->enum_type($index$);\n";
  }
  else {
    ClassName_abi_cxx11_
              (&local_68,*(cpp **)(this->descriptor_ + 0x18),(Descriptor *)0x0,(bool)qualified);
    std::__cxx11::string::string((string *)&local_88,"parent",&local_89);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_88);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    text = 
    "file_level_enum_descriptors[$index_in_metadata$] = $parent$_descriptor->enum_type($index$);\n";
  }
  io::Printer::Print(printer,&vars,text);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void EnumGenerator::GenerateDescriptorInitializer(io::Printer* printer) {
  std::map<string, string> vars;
  vars["index"] = SimpleItoa(descriptor_->index());
  vars["index_in_metadata"] = SimpleItoa(index_in_metadata_);

  if (descriptor_->containing_type() == NULL) {
    printer->Print(vars,
                   "file_level_enum_descriptors[$index_in_metadata$] = "
                   "file->enum_type($index$);\n");
  } else {
    vars["parent"] = ClassName(descriptor_->containing_type(), false);
    printer->Print(vars,
                   "file_level_enum_descriptors[$index_in_metadata$] = "
                   "$parent$_descriptor->enum_type($index$);\n");
  }
}